

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconvert_linux.c
# Opt level: O0

void CharConvWW(charconv *CC,wchar_t *Out,size_t OutLen,wchar_t *In)

{
  size_t sVar1;
  size_t local_58;
  size_t n;
  size_t _OutLen;
  char *_Out;
  size_t _InLen;
  char *_In;
  wchar_t *In_local;
  size_t OutLen_local;
  wchar_t *Out_local;
  charconv *CC_local;
  
  if (OutLen != 0) {
    _InLen = (size_t)In;
    _In = (char *)In;
    In_local = (wchar_t *)OutLen;
    OutLen_local = (size_t)Out;
    Out_local = (wchar_t *)CC;
    sVar1 = wcslen(In);
    _Out = (char *)((sVar1 + 1) * 4);
    _OutLen = OutLen_local;
    n = (long)In_local << 2;
    if ((((Out_local == (wchar_t *)0x0) || (_Out == (char *)0x0)) ||
        (sVar1 = iconv(Out_local,(char **)&_InLen,(size_t *)&_Out,(char **)&_OutLen,&n),
        sVar1 == 0xffffffffffffffff)) ||
       (sVar1 = iconv(Out_local,(char **)0x0,(size_t *)0x0,(char **)&_OutLen,&n),
       sVar1 == 0xffffffffffffffff)) {
      sVar1 = wcslen((wchar_t *)_In);
      if ((long)In_local - 1U < sVar1) {
        local_58 = (long)In_local - 1;
      }
      else {
        local_58 = wcslen((wchar_t *)_In);
      }
      memcpy((void *)OutLen_local,_In,local_58 << 2);
      *(undefined4 *)(OutLen_local + local_58 * 4) = 0;
      if ((Out_local != (wchar_t *)0x0) && (_Out != (char *)0x0)) {
        iconv(Out_local,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
      }
    }
    else {
      *(undefined4 *)_OutLen = 0;
    }
  }
  return;
}

Assistant:

void CharConvWW(charconv* CC, wchar_t* Out, size_t OutLen, const wchar_t* In)
{
    if (OutLen>0)
    {
        ICONV_CONST char* _In = (ICONV_CONST char*)In;
        size_t _InLen = (wcslen(In)+1)*sizeof(wchar_t);
        char* _Out = (char*)Out;
        size_t _OutLen = OutLen*sizeof(wchar_t);

        if (!CC || !_InLen || iconv((iconv_t)CC, &_In, &_InLen, &_Out, &_OutLen) == (size_t)-1 ||
                iconv((iconv_t)CC, NULL, NULL, &_Out, &_OutLen) == (size_t)-1)
        {
            size_t n = MIN(wcslen(In),OutLen-1);
            memcpy(Out,In,n*sizeof(wchar_t));
            Out[n] = 0;
                if (CC && _InLen) iconv((iconv_t)CC, NULL, NULL, NULL, NULL); // reset state
        }
        else
            *(wchar_t*)_Out=0;
   }
}